

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

void pushvalue(lua_State *L,lua_State *sL,uint8_t vt,value *v)

{
  char *s;
  char *str;
  size_t sz;
  value *v_local;
  lua_State *plStack_18;
  uint8_t vt_local;
  lua_State *sL_local;
  lua_State *L_local;
  
  sz = (size_t)v;
  v_local._7_1_ = vt;
  plStack_18 = sL;
  sL_local = L;
  switch(vt) {
  case '\x01':
    lua_pushnumber(L,v->n);
    break;
  case '\x02':
    str = (char *)0x0;
    s = lua_tolstring(sL,v->string,(size_t *)&str);
    lua_pushlstring(sL_local,s,(size_t)str);
    break;
  case '\x03':
    lua_pushboolean(L,v->string);
    break;
  case '\x04':
    lua_pushlightuserdata(L,v->tbl);
    break;
  case '\x05':
    lua_pushinteger(L,v->d);
    break;
  default:
    lua_pushnil(L);
  }
  return;
}

Assistant:

static void
pushvalue(lua_State *L, lua_State *sL, uint8_t vt, union value *v) {
	switch(vt) {
	case VALUETYPE_REAL:
		lua_pushnumber(L, v->n);
		break;
	case VALUETYPE_INTEGER:
		lua_pushinteger(L, v->d);
		break;
	case VALUETYPE_STRING: {
		size_t sz = 0;
		const char *str = lua_tolstring(sL, v->string, &sz);
		lua_pushlstring(L, str, sz);
		break;
	}
	case VALUETYPE_BOOLEAN:
		lua_pushboolean(L, v->boolean);
		break;
	case VALUETYPE_TABLE:
		lua_pushlightuserdata(L, v->tbl);
		break;
	default:
		lua_pushnil(L);
		break;
	}
}